

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeparser.cpp
# Opt level: O1

void __thiscall
NodeParser::parseCoords
          (NodeParser *this,Node *node,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  InputError *pIVar4;
  string local_88;
  string local_68;
  string local_48;
  
  pbVar1 = (tokenList->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(tokenList->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x41) {
    pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
    InputError::InputError(pIVar4,2,&local_88);
    __cxa_throw(pIVar4,&InputError::typeinfo,ENerror::~ENerror);
  }
  bVar3 = Utilities::parseNumber<double>(pbVar1 + 1,&node->xCoord);
  if (bVar3) {
    bVar3 = Utilities::parseNumber<double>(pbVar1 + 2,&node->yCoord);
    if (bVar3) {
      return;
    }
    pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    pcVar2 = pbVar1[2]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar2,pcVar2 + pbVar1[2]._M_string_length);
    InputError::InputError(pIVar4,6,&local_48);
    __cxa_throw(pIVar4,&InputError::typeinfo,ENerror::~ENerror);
  }
  pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  pcVar2 = pbVar1[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + pbVar1[1]._M_string_length);
  InputError::InputError(pIVar4,6,&local_68);
  __cxa_throw(pIVar4,&InputError::typeinfo,ENerror::~ENerror);
}

Assistant:

void NodeParser::parseCoords(Node* node, vector<string>& tokenList)
{
    // Contents of tokenList are:
    // 0 - node ID
    // 1 - x coordinate
    // 2 - y coordinate

    if ( tokenList.size() < 3 ) throw InputError(InputError::TOO_FEW_ITEMS, "");
    string* tokens = &tokenList[0];

    if ( !Utilities::parseNumber(tokens[1], node->xCoord) )
    {
        throw InputError(InputError::INVALID_NUMBER, tokens[1]);
    }
    if ( !Utilities::parseNumber(tokens[2], node->yCoord) )
    {
        throw InputError(InputError::INVALID_NUMBER, tokens[2]);
    }
}